

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O0

void Gia_ManPrintObjClasses(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int i_00;
  int iVar7;
  uint *__ptr;
  int *__ptr_00;
  Vec_Int_t *p_01;
  uint *p_02;
  int *pCountUni;
  int *pCountAll;
  uint *pInfo;
  int nWords;
  int iFrame;
  int iObj;
  int nObjMask;
  int nObjBits;
  int nFrames;
  int iStop;
  int iStart;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vAbs;
  Vec_Int_t *vSeens;
  Gia_Man_t *p_local;
  
  p_00 = p->vObjClasses;
  nObjBits = -1;
  if (p_00 != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntEntry(p_00,0);
    iVar2 = Vec_IntEntry(p_00,iVar1 + 1);
    iVar3 = Vec_IntSize(p_00);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                    ,0x17a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
    }
    __ptr = (uint *)malloc((long)(iVar1 + 1) << 2);
    __ptr_00 = (int *)malloc((long)(iVar1 + 1) << 2);
    iVar2 = Abc_BitWordNum(iVar1);
    iVar3 = Gia_ManObjNum(p);
    p_01 = Vec_IntStart(iVar3 * iVar2);
    uVar4 = Gia_ManObjNum(p);
    iVar3 = Abc_Base2Log(uVar4);
    uVar4 = (1 << ((byte)iVar3 & 0x1f)) - 1;
    iVar5 = Gia_ManObjNum(p);
    if ((int)uVar4 < iVar5) {
      __assert_fail("Gia_ManObjNum(p) <= nObjMask",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                    ,0x183,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
    }
    printf("Frame   Core   F0   F1   F2   F3 ...\n");
    for (Entry = 0; Entry < iVar1; Entry = Entry + 1) {
      iVar5 = Vec_IntEntry(p_00,Entry + 1);
      nObjBits = Vec_IntEntry(p_00,Entry + 2);
      memset(__ptr,0,(long)(iVar1 + 1) << 2);
      memset(__ptr_00,0,(long)(iVar1 + 1) << 2);
      for (iStart = iVar5; iStart < nObjBits; iStart = iStart + 1) {
        uVar6 = Vec_IntEntry(p_00,iStart);
        i_00 = (int)uVar6 >> ((byte)iVar3 & 0x1f);
        p_02 = (uint *)Vec_IntEntryP(p_01,iVar2 * (uVar6 & uVar4));
        iVar7 = Abc_InfoHasBit(p_02,i_00);
        if (iVar7 == 0) {
          Abc_InfoSetBit(p_02,i_00);
          __ptr_00[i_00 + 1] = __ptr_00[i_00 + 1] + 1;
          *__ptr_00 = *__ptr_00 + 1;
        }
        __ptr[i_00 + 1] = __ptr[i_00 + 1] + 1;
        *__ptr = *__ptr + 1;
      }
      if (*__ptr != nObjBits - iVar5) {
        __assert_fail("pCountAll[0] == (iStop - iStart)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                      ,0x19a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      printf("%3d :",(ulong)(uint)Entry);
      printf("%7d",(ulong)*__ptr);
      if (Entry < 10) {
        for (iStart = 0; iStart <= Entry; iStart = iStart + 1) {
          if (iStart <= Entry) {
            printf("%5d",(ulong)__ptr[iStart + 1]);
          }
        }
      }
      else {
        for (iStart = 0; iStart < 4; iStart = iStart + 1) {
          printf("%5d",(ulong)__ptr[iStart + 1]);
        }
        printf("  ...");
        for (iStart = Entry + -4; iStart <= Entry; iStart = iStart + 1) {
          printf("%5d",(ulong)__ptr[iStart + 1]);
        }
      }
      printf("\n");
    }
    iVar1 = Vec_IntSize(p_00);
    if (nObjBits != iVar1) {
      __assert_fail("iStop == Vec_IntSize(vAbs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                    ,0x1b1,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
    }
    Vec_IntFree(p_01);
    if (__ptr != (uint *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
  }
  return;
}

Assistant:

void Gia_ManPrintObjClasses( Gia_Man_t * p )
{
    Vec_Int_t * vSeens;  // objects seen so far
    Vec_Int_t * vAbs = p->vObjClasses;
    int i, k, Entry, iStart, iStop = -1, nFrames;
    int nObjBits, nObjMask, iObj, iFrame, nWords;
    unsigned * pInfo;
    int * pCountAll, * pCountUni;
    if ( vAbs == NULL )
        return;
    nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    pCountAll = ABC_ALLOC( int, nFrames + 1 );
    pCountUni = ABC_ALLOC( int, nFrames + 1 );
    // start storage for seen objects
    nWords = Abc_BitWordNum( nFrames );
    vSeens = Vec_IntStart( Gia_ManObjNum(p) * nWords );
    // get the bitmasks
    nObjBits = Abc_Base2Log( Gia_ManObjNum(p) );
    nObjMask = (1 << nObjBits) - 1;
    assert( Gia_ManObjNum(p) <= nObjMask );
    // print info about frames
    printf( "Frame   Core   F0   F1   F2   F3 ...\n" );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        memset( pCountAll, 0, sizeof(int) * (nFrames + 1) );
        memset( pCountUni, 0, sizeof(int) * (nFrames + 1) );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
        {
            iObj   = (Entry &  nObjMask);
            iFrame = (Entry >> nObjBits);
            pInfo  = (unsigned *)Vec_IntEntryP( vSeens, nWords * iObj );
            if ( Abc_InfoHasBit(pInfo, iFrame) == 0 )
            {
                Abc_InfoSetBit( pInfo, iFrame );
                pCountUni[iFrame+1]++;
                pCountUni[0]++;
            }
            pCountAll[iFrame+1]++;
            pCountAll[0]++;
        }
        assert( pCountAll[0] == (iStop - iStart) );
//        printf( "%5d%5d  ", pCountAll[0], pCountUni[0] ); 
        printf( "%3d :", i );
        printf( "%7d", pCountAll[0] ); 
        if ( i >= 10 )
        {
            for ( k = 0; k < 4; k++ )
                printf( "%5d", pCountAll[k+1] ); 
            printf( "  ..." );
            for ( k = i-4; k <= i; k++ )
                printf( "%5d", pCountAll[k+1] ); 
        }
        else
        {
            for ( k = 0; k <= i; k++ )
                if ( k <= i )
                    printf( "%5d", pCountAll[k+1] ); 
        }
//        for ( k = 0; k < nFrames; k++ )
//            if ( k <= i )
//                printf( "%5d", pCountAll[k+1] ); 
        printf( "\n" );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    Vec_IntFree( vSeens );
    ABC_FREE( pCountAll );
    ABC_FREE( pCountUni );
}